

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_TextureMapping::SetSurfaceParameterMapping(ON_TextureMapping *this)

{
  bool bVar1;
  ON_TextureMapping *this_local;
  
  bVar1 = ON_IsNullPtr(this);
  if (!bVar1) {
    operator=(this,&SurfaceParameterTextureMapping);
    ON_ModelComponent::SetId(&this->super_ON_ModelComponent);
  }
  return true;
}

Assistant:

bool ON_TextureMapping::SetSurfaceParameterMapping(void)
{
  // The nullptr check is wierd.
  // Speculation: A reference was null and somebody added this
  // as a hack to prevent a crash.
  if ( false == ON_IsNullPtr(this) )
  {
    *this = ON_TextureMapping::SurfaceParameterTextureMapping;
    SetId(); // new id
  }
	return true;
}